

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O2

void sortSetData(HighsInt num_entries,vector<int,_std::allocator<int>_> *set,double *data0,
                double *data1,double *data2,double *sorted_data0,double *sorted_data1,
                double *sorted_data2)

{
  pointer piVar1;
  ulong uVar2;
  long lVar3;
  vector<int,_std::allocator<int>_> perm_vec;
  vector<int,_std::allocator<int>_> sort_set_vec;
  allocator_type local_71;
  vector<int,_std::allocator<int>_> *local_70;
  double *local_68;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  if (0 < num_entries) {
    local_70 = set;
    local_68 = sorted_data0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_48,(ulong)(num_entries + 1),
               (allocator_type *)&local_60);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_60,(ulong)(num_entries + 1),&local_71);
    piVar1 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar2 = 0; (uint)num_entries != uVar2; uVar2 = uVar2 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[uVar2 + 1] = piVar1[uVar2];
      local_60._M_impl.super__Vector_impl_data._M_start[uVar2 + 1] = (HighsInt)uVar2;
    }
    maxheapsort(local_48._M_impl.super__Vector_impl_data._M_start,
                local_60._M_impl.super__Vector_impl_data._M_start,num_entries);
    piVar1 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar3 = 0; (ulong)(uint)num_entries << 2 != lVar3; lVar3 = lVar3 + 4) {
      *(undefined4 *)((long)piVar1 + lVar3) =
           *(undefined4 *)((long)local_48._M_impl.super__Vector_impl_data._M_start + lVar3 + 4);
      if (data0 != (double *)0x0) {
        *(double *)((long)local_68 + lVar3 * 2) =
             data0[*(int *)((long)local_60._M_impl.super__Vector_impl_data._M_start + lVar3 + 4)];
      }
      if (data1 != (double *)0x0) {
        *(double *)((long)sorted_data1 + lVar3 * 2) =
             data1[*(int *)((long)local_60._M_impl.super__Vector_impl_data._M_start + lVar3 + 4)];
      }
      if (data2 != (double *)0x0) {
        *(double *)((long)sorted_data2 + lVar3 * 2) =
             data2[*(int *)((long)local_60._M_impl.super__Vector_impl_data._M_start + lVar3 + 4)];
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void sortSetData(const HighsInt num_entries, vector<HighsInt>& set,
                 const double* data0, const double* data1, const double* data2,
                 double* sorted_data0, double* sorted_data1,
                 double* sorted_data2) {
  if (num_entries <= 0) return;
  vector<HighsInt> sort_set_vec(1 + num_entries);
  vector<HighsInt> perm_vec(1 + num_entries);

  HighsInt* sort_set = sort_set_vec.data();
  HighsInt* perm = perm_vec.data();

  for (HighsInt ix = 0; ix < num_entries; ix++) {
    sort_set[1 + ix] = set[ix];
    perm[1 + ix] = ix;
  }
  maxheapsort(sort_set, perm, num_entries);
  for (HighsInt ix = 0; ix < num_entries; ix++) {
    set[ix] = sort_set[1 + ix];
    if (data0 != NULL) sorted_data0[ix] = data0[perm[1 + ix]];
    if (data1 != NULL) sorted_data1[ix] = data1[perm[1 + ix]];
    if (data2 != NULL) sorted_data2[ix] = data2[perm[1 + ix]];
  }
}